

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.cpp
# Opt level: O1

void __thiscall
helics::BasicHandleInfo::setTag(BasicHandleInfo *this,string_view tag,string_view value)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  size_type __len2;
  char *__s1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t __n;
  char *__s;
  size_type __rlen;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __s = value._M_str;
  __len2 = value._M_len;
  __s1 = tag._M_str;
  __n = tag._M_len;
  ppVar1 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppVar1 == ppVar2;
  local_50._M_len = __len2;
  local_50._M_str = __s;
  local_40._M_len = __n;
  local_40._M_str = __s1;
  if (!bVar4) {
    this_00 = &ppVar1->second;
    do {
      if ((this_00[-1]._M_string_length == __n) &&
         ((__n == 0 || (iVar3 = bcmp(__s1,this_00[-1]._M_dataplus._M_p,__n), iVar3 == 0)))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace(this_00,0,this_00->_M_string_length,__s,__len2);
        if (!bVar4) {
          return;
        }
        break;
      }
      bVar4 = (pointer)(this_00 + 1) == ppVar2;
      this_00 = this_00 + 2;
    } while (!bVar4);
  }
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->tags,&local_40,&local_50);
  return;
}

Assistant:

void BasicHandleInfo::setTag(std::string_view tag, std::string_view value)
{
    for (auto& tg : tags) {
        if (tg.first == tag) {
            tg.second = value;
            return;
        }
    }
    tags.emplace_back(tag, value);
}